

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O0

wchar_t inven_damage(player *p,wchar_t type,wchar_t cperc)

{
  _Bool _Var1;
  char cVar2;
  wchar_t wVar3;
  char *pcVar4;
  char *pcVar5;
  char *local_c0;
  char *local_b8;
  _Bool local_a9;
  object *poStack_a8;
  _Bool none_left;
  object *destroyed;
  char acStack_98 [4];
  wchar_t chance;
  object *next;
  char local_88 [7];
  _Bool damage;
  char o_name [80];
  object *obj;
  wchar_t local_28;
  wchar_t amt;
  wchar_t k;
  wchar_t j;
  wchar_t cperc_local;
  wchar_t type_local;
  player *p_local;
  
  o_name._72_8_ = p->gear;
  if (cperc < L'\x01') {
    return L'\0';
  }
  local_28 = L'\0';
LAB_001f80fd:
  while( true ) {
    while( true ) {
      if (o_name._72_8_ == 0) {
        return local_28;
      }
      _acStack_98 = *(undefined8 *)(o_name._72_8_ + 0x20);
      _Var1 = object_is_equipped(p->body,(object *)o_name._72_8_);
      if (!_Var1) break;
      o_name[0x48] = acStack_98[0];
      o_name[0x49] = acStack_98[1];
      o_name[0x4a] = acStack_98[2];
      o_name[0x4b] = acStack_98[3];
      o_name[0x4c] = (char)chance;
      o_name[0x4d] = chance._1_1_;
      o_name[0x4e] = chance._2_1_;
      o_name[0x4f] = chance._3_1_;
    }
    if (*(long *)(o_name._72_8_ + 0x10) == 0) break;
    o_name[0x48] = acStack_98[0];
    o_name[0x49] = acStack_98[1];
    o_name[0x4a] = acStack_98[2];
    o_name[0x4b] = acStack_98[3];
    o_name[0x4c] = (char)chance;
    o_name[0x4d] = chance._1_1_;
    o_name[0x4e] = chance._2_1_;
    o_name[0x4f] = chance._3_1_;
  }
  if (((*(byte *)(o_name._72_8_ + 0x74 + (long)type * 4) & 1) != 0) &&
     ((*(byte *)(o_name._72_8_ + 0x74 + (long)type * 4) & 2) == 0)) {
    next._7_1_ = 0;
    destroyed._4_4_ = cperc;
    _Var1 = tval_is_weapon((object *)o_name._72_8_);
    if ((!_Var1) || (_Var1 = tval_is_ammo((object *)o_name._72_8_), _Var1)) {
      _Var1 = tval_is_armor((object *)o_name._72_8_);
      if (!_Var1) {
        _Var1 = tval_is_rod((object *)o_name._72_8_);
        if (_Var1) {
          destroyed._4_4_ = destroyed._4_4_ / 4;
        }
        goto LAB_001f830b;
      }
      wVar3 = Rand_div(10000);
      if (wVar3 < cperc) {
        *(short *)(o_name._72_8_ + 0x46) = *(short *)(o_name._72_8_ + 0x46) + -1;
        if (p->obj_k->to_a != 0) {
          *(undefined2 *)(*(long *)(o_name._72_8_ + 0x28) + 0x46) =
               *(undefined2 *)(o_name._72_8_ + 0x46);
        }
        next._7_1_ = 1;
        goto LAB_001f830b;
      }
      o_name[0x48] = acStack_98[0];
      o_name[0x49] = acStack_98[1];
      o_name[0x4a] = acStack_98[2];
      o_name[0x4b] = acStack_98[3];
      o_name[0x4c] = (char)chance;
      o_name[0x4d] = chance._1_1_;
      o_name[0x4e] = chance._2_1_;
      o_name[0x4f] = chance._3_1_;
      goto LAB_001f80fd;
    }
    wVar3 = Rand_div(10000);
    if (cperc <= wVar3) {
      o_name[0x48] = acStack_98[0];
      o_name[0x49] = acStack_98[1];
      o_name[0x4a] = acStack_98[2];
      o_name[0x4b] = acStack_98[3];
      o_name[0x4c] = (char)chance;
      o_name[0x4d] = chance._1_1_;
      o_name[0x4e] = chance._2_1_;
      o_name[0x4f] = chance._3_1_;
      goto LAB_001f80fd;
    }
    *(short *)(o_name._72_8_ + 0x48) = *(short *)(o_name._72_8_ + 0x48) + -1;
    if (p->obj_k->to_h != 0) {
      *(undefined2 *)(*(long *)(o_name._72_8_ + 0x28) + 0x48) =
           *(undefined2 *)(o_name._72_8_ + 0x48);
    }
    *(short *)(o_name._72_8_ + 0x4a) = *(short *)(o_name._72_8_ + 0x4a) + -1;
    if (p->obj_k->to_d != 0) {
      *(undefined2 *)(*(long *)(o_name._72_8_ + 0x28) + 0x4a) =
           *(undefined2 *)(o_name._72_8_ + 0x4a);
    }
    next._7_1_ = 1;
LAB_001f830b:
    if ((next._7_1_ & 1) == 0) {
      obj._4_4_ = L'\0';
      for (amt = L'\0'; amt < (int)(uint)*(byte *)(o_name._72_8_ + 0x11a); amt = amt + L'\x01') {
        wVar3 = Rand_div(10000);
        if (wVar3 < destroyed._4_4_) {
          obj._4_4_ = obj._4_4_ + L'\x01';
        }
      }
    }
    else {
      p->upkeep->update = p->upkeep->update | 1;
      p->upkeep->redraw = p->upkeep->redraw | 0x40000;
      obj._4_4_ = (wchar_t)*(byte *)(o_name._72_8_ + 0x11a);
    }
    if (obj._4_4_ == L'\0') goto LAB_001f852a;
    local_a9 = false;
    object_desc(local_88,0x50,(object *)o_name._72_8_,0,p);
    if (*(byte *)(o_name._72_8_ + 0x11a) < 2) {
      local_c0 = "Y";
    }
    else {
      if (obj._4_4_ == (uint)*(byte *)(o_name._72_8_ + 0x11a)) {
        local_b8 = "All of y";
      }
      else {
        local_b8 = "One of y";
        if (L'\x01' < obj._4_4_) {
          local_b8 = "Some of y";
        }
      }
      local_c0 = local_b8;
    }
    cVar2 = gear_to_label(p,(object *)o_name._72_8_);
    pcVar5 = "was";
    if (L'\x01' < obj._4_4_) {
      pcVar5 = "were";
    }
    pcVar4 = "destroyed";
    if ((next._7_1_ & 1) != 0) {
      pcVar4 = "damaged";
    }
    msgt(0x21,"%sour %s (%c) %s %s!",local_c0,local_88,(ulong)(uint)(int)cVar2,pcVar5,pcVar4);
    if ((next._7_1_ & 1) != 0) goto LAB_001f80fd;
    poStack_a8 = gear_object_for_use(p,(object *)o_name._72_8_,obj._4_4_,false,&local_a9);
    if (poStack_a8->known != (object *)0x0) {
      object_delete((chunk *)0x0,(chunk *)0x0,&poStack_a8->known);
    }
    object_delete((chunk *)0x0,(chunk *)0x0,&stack0xffffffffffffff58);
    local_28 = obj._4_4_ + local_28;
  }
LAB_001f852a:
  o_name[0x48] = acStack_98[0];
  o_name[0x49] = acStack_98[1];
  o_name[0x4a] = acStack_98[2];
  o_name[0x4b] = acStack_98[3];
  o_name[0x4c] = (char)chance;
  o_name[0x4d] = chance._1_1_;
  o_name[0x4e] = chance._2_1_;
  o_name[0x4f] = chance._3_1_;
  goto LAB_001f80fd;
}

Assistant:

int inven_damage(struct player *p, int type, int cperc)
{
	int j, k, amt;
	struct object *obj = p->gear;
	char o_name[80];
	bool damage;

	/* No chance means no damage */
	if (cperc <= 0)
		return 0;

	/* Count the casualties */
	k = 0;

	/* Scan through the gear */
	while (obj) {
		struct object *next = obj->next;
		if (object_is_equipped(p->body, obj)) {
			obj = next;
			continue;
		}

		/* Hack -- for now, skip artifacts */
		if (obj->artifact) {
			obj = next;
			continue;
		}

		/* Give this item slot a shot at death if it is vulnerable */
		if ((obj->el_info[type].flags & EL_INFO_HATES) &&
			!(obj->el_info[type].flags & EL_INFO_IGNORE)) {
			/* Chance to destroy this item */
			int chance = cperc;

			/* Track if it is damaged instead of destroyed */
			damage = false;

			/* Analyze the type to see if we just damage it
			 * - we also check for rods to reduce chance */
			if (tval_is_weapon(obj) && !tval_is_ammo(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_h--;
					if (p->obj_k->to_h)
						obj->known->to_h = obj->to_h;
					obj->to_d--;
					if (p->obj_k->to_d)
						obj->known->to_d = obj->to_d;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_armor(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_a--;
					if (p->obj_k->to_a)
						obj->known->to_a = obj->to_a;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_rod(obj)) {
				chance = (chance / 4);
			}


			/* Damage instead of destroy */
			if (damage) {
				p->upkeep->update |= (PU_BONUS);
				p->upkeep->redraw |= (PR_EQUIP);

				/* Casualty count */
				amt = obj->number;
			} else
				/* ... or count the casualties */
				for (amt = j = 0; j < obj->number; ++j)
					if (randint0(10000) < chance) amt++;

			/* Some casualities */
			if (amt) {
				struct object *destroyed;
				bool none_left = false;

				/* Get a description */
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_BASE, p);

				/* Message */
				msgt(MSG_DESTROY, "%sour %s (%c) %s %s!",
				           ((obj->number > 1) ?
				            ((amt == obj->number) ? "All of y" :
				             (amt > 1 ? "Some of y" : "One of y")) : "Y"),
				           o_name, gear_to_label(p, obj),
				           ((amt > 1) ? "were" : "was"),
					   (damage ? "damaged" : "destroyed"));

				/* Damage already done? */
				if (damage)
					continue;

				/* Destroy "amt" items */
				destroyed = gear_object_for_use(p, obj, amt,
					false, &none_left);
				if (destroyed->known)
					object_delete(NULL, NULL, &destroyed->known);
				object_delete(NULL, NULL, &destroyed);

				/* Count the casualties */
				k += amt;
			}
		}
		obj = next;
	}

	/* Return the casualty count */
	return (k);
}